

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_line_strip(rf_vec2 *points,int points_count,rf_color color)

{
  _Bool _Var1;
  long local_28;
  rf_int i;
  int points_count_local;
  rf_vec2 *points_local;
  rf_color color_local;
  
  if (1 < points_count) {
    _Var1 = rf_gfx_check_buffer_limit(points_count);
    if (_Var1) {
      rf_gfx_draw();
    }
    rf_gfx_begin(RF_LINES);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rf_gfx_color4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_28 = 0; local_28 < points_count + -1; local_28 = local_28 + 1) {
      rf_gfx_vertex2f(points[local_28].x,points[local_28].y);
      rf_gfx_vertex2f(points[local_28 + 1].x,points[local_28 + 1].y);
    }
    rf_gfx_end();
  }
  return;
}

Assistant:

RF_API void rf_draw_line_strip(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 2)
    {
        if (rf_gfx_check_buffer_limit(points_count)) rf_gfx_draw();

        rf_gfx_begin(RF_LINES);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 0; i < points_count - 1; i++)
        {
            rf_gfx_vertex2f(points[i].x, points[i].y);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
    }
}